

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

void UpdateAllSourceProps(ALCcontext *context)

{
  __atomic_flag_data_type _Var1;
  __int_type _Var2;
  __pointer_type pFVar3;
  __int_type_conflict2 _Var4;
  Voice *voice;
  pointer pSVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ALsource *source;
  long lVar9;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&context->mSourceLock);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pFVar3 = (context->mVoices)._M_b._M_p;
  _Var4 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  if (_Var4 != 0) {
    lVar9 = 0;
    do {
      voice = *(Voice **)((long)&pFVar3->field_1 + lVar9);
      _Var2 = (voice->mSourceID).super___atomic_base<unsigned_int>._M_i;
      if (_Var2 == 0) {
LAB_0012a0e4:
        source = (ALsource *)0x0;
      }
      else {
        uVar7 = _Var2 - 1;
        pSVar5 = (context->mSourceList).
                 super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((ulong)((long)(context->mSourceList).
                           super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 4) <=
             (ulong)(uVar7 >> 6)) ||
           (uVar8 = (ulong)((uVar7 >> 6) << 4),
           (*(ulong *)((long)&pSVar5->FreeMask + uVar8) >> ((ulong)uVar7 & 0x3f) & 1) != 0))
        goto LAB_0012a0e4;
        source = (ALsource *)
                 ((ulong)(uVar7 & 0x3f) * 0x198 + *(long *)((long)&pSVar5->Sources + uVar8));
      }
      if (source != (ALsource *)0x0) {
        LOCK();
        _Var1 = (source->PropsClean).super___atomic_flag_base._M_i;
        (source->PropsClean).super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var1 == false) {
          anon_unknown.dwarf_55dd6::UpdateSourceProps(source,voice,context);
        }
      }
      lVar9 = lVar9 + 8;
    } while (_Var4 << 3 != lVar9);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&context->mSourceLock);
  return;
}

Assistant:

void UpdateAllSourceProps(ALCcontext *context)
{
    std::lock_guard<std::mutex> _{context->mSourceLock};
    auto voicelist = context->getVoicesSpan();
    std::for_each(voicelist.begin(), voicelist.end(),
        [context](Voice *voice) -> void
        {
            ALuint sid{voice->mSourceID.load(std::memory_order_acquire)};
            ALsource *source = sid ? LookupSource(context, sid) : nullptr;
            if(source && !source->PropsClean.test_and_set(std::memory_order_acq_rel))
                UpdateSourceProps(source, voice, context);
        }
    );
}